

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match.c
# Opt level: O0

_Bool av1_compute_global_motion_feature_match
                (TransformationType type,YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *ref,
                int bit_depth,int downsample_level,MotionModel *motion_models,int num_motion_models,
                _Bool *mem_alloc_failed)

{
  long lVar1;
  long lVar2;
  _Bool _Var3;
  int iVar4;
  void *pvVar5;
  long in_RDX;
  long in_RSI;
  undefined4 in_stack_00000010;
  int in_stack_00000014;
  int *in_stack_00000018;
  uchar *in_stack_00000020;
  _Bool result;
  int ref_stride;
  uint8_t *ref_buffer;
  uchar *in_stack_00000038;
  int src_stride;
  int src_height;
  int src_width;
  uint8_t *src_buffer;
  CornerList *ref_corners;
  ImagePyramid *ref_pyramid;
  CornerList *src_corners;
  ImagePyramid *src_pyramid;
  Correspondence *correspondences;
  int num_correspondences;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  TransformationType type_00;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff64;
  undefined1 local_11;
  
  lVar1 = *(long *)(in_RSI + 0x60);
  lVar2 = *(long *)(in_RDX + 0x60);
  iVar4 = aom_compute_pyramid((YV12_BUFFER_CONFIG *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                              (ImagePyramid *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (iVar4 < 0) {
    *(undefined1 *)CONCAT44(in_stack_00000014,in_stack_00000010) = 1;
    local_11 = false;
  }
  else {
    _Var3 = av1_compute_corner_list
                      ((YV12_BUFFER_CONFIG *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                       (CornerList *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (_Var3) {
      iVar4 = aom_compute_pyramid((YV12_BUFFER_CONFIG *)
                                  CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                  in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                                  (ImagePyramid *)
                                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      if (iVar4 < 0) {
        *(undefined1 *)CONCAT44(in_stack_00000014,in_stack_00000010) = 1;
        local_11 = false;
      }
      else {
        _Var3 = av1_compute_corner_list
                          ((YV12_BUFFER_CONFIG *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                           (CornerList *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        if (_Var3) {
          uVar6 = *(undefined4 *)(*(long *)(lVar1 + 0x38) + 0xc);
          type_00 = (TransformationType)
                    ((uint)*(undefined4 *)(*(long *)(lVar1 + 0x38) + 0x10) >> 0x18);
          uVar7 = *(undefined4 *)(*(long *)(lVar2 + 0x38) + 0x10);
          pvVar5 = aom_malloc(0x39f40f);
          if (pvVar5 == (void *)0x0) {
            *(undefined1 *)CONCAT44(in_stack_00000014,in_stack_00000010) = 1;
            local_11 = false;
          }
          else {
            determine_correspondence
                      (in_stack_00000038,(int *)ref_buffer,ref_stride,in_stack_00000020,
                       in_stack_00000018,in_stack_00000014,(int)ref_corners,(int)ref_pyramid,
                       (int)src_corners,(int)src_pyramid,correspondences);
            local_11 = ransac((Correspondence *)CONCAT44(in_stack_ffffffffffffff64,uVar7),
                              in_stack_ffffffffffffff5c,type_00,
                              (MotionModel *)CONCAT44(in_stack_ffffffffffffff54,uVar6),
                              in_stack_ffffffffffffff4c,(_Bool *)0x39f4c7);
            aom_free((void *)CONCAT44(in_stack_ffffffffffffff54,uVar6));
          }
        }
        else {
          *(undefined1 *)CONCAT44(in_stack_00000014,in_stack_00000010) = 1;
          local_11 = false;
        }
      }
    }
    else {
      *(undefined1 *)CONCAT44(in_stack_00000014,in_stack_00000010) = 1;
      local_11 = false;
    }
  }
  return local_11;
}

Assistant:

bool av1_compute_global_motion_feature_match(
    TransformationType type, YV12_BUFFER_CONFIG *src, YV12_BUFFER_CONFIG *ref,
    int bit_depth, int downsample_level, MotionModel *motion_models,
    int num_motion_models, bool *mem_alloc_failed) {
  int num_correspondences;
  Correspondence *correspondences;
  ImagePyramid *src_pyramid = src->y_pyramid;
  CornerList *src_corners = src->corners;
  ImagePyramid *ref_pyramid = ref->y_pyramid;
  CornerList *ref_corners = ref->corners;

  // Precompute information we will need about each frame
  if (aom_compute_pyramid(src, bit_depth, 1, src_pyramid) < 0) {
    *mem_alloc_failed = true;
    return false;
  }
  if (!av1_compute_corner_list(src, bit_depth, downsample_level, src_corners)) {
    *mem_alloc_failed = true;
    return false;
  }
  if (aom_compute_pyramid(ref, bit_depth, 1, ref_pyramid) < 0) {
    *mem_alloc_failed = true;
    return false;
  }
  if (!av1_compute_corner_list(src, bit_depth, downsample_level, ref_corners)) {
    *mem_alloc_failed = true;
    return false;
  }

  const uint8_t *src_buffer = src_pyramid->layers[0].buffer;
  const int src_width = src_pyramid->layers[0].width;
  const int src_height = src_pyramid->layers[0].height;
  const int src_stride = src_pyramid->layers[0].stride;

  const uint8_t *ref_buffer = ref_pyramid->layers[0].buffer;
  assert(ref_pyramid->layers[0].width == src_width);
  assert(ref_pyramid->layers[0].height == src_height);
  const int ref_stride = ref_pyramid->layers[0].stride;

  // find correspondences between the two images
  correspondences = (Correspondence *)aom_malloc(src_corners->num_corners *
                                                 sizeof(*correspondences));
  if (!correspondences) {
    *mem_alloc_failed = true;
    return false;
  }
  num_correspondences = determine_correspondence(
      src_buffer, src_corners->corners, src_corners->num_corners, ref_buffer,
      ref_corners->corners, ref_corners->num_corners, src_width, src_height,
      src_stride, ref_stride, correspondences);

  bool result = ransac(correspondences, num_correspondences, type,
                       motion_models, num_motion_models, mem_alloc_failed);

  aom_free(correspondences);
  return result;
}